

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

SourceCodeInfo_Location * __thiscall
google::protobuf::FileDescriptorTables::GetSourceLocation
          (FileDescriptorTables *this,vector<int,_std::allocator<int>_> *path,SourceCodeInfo *info)

{
  bool bVar1;
  SourceCodeInfo_Location *pSVar2;
  pointer prVar3;
  string_view s;
  iterator it;
  pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*> p;
  AlphaNumFormatterImpl *in_stack_ffffffffffffffa8;
  string local_50;
  iterator local_30;
  pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
  local_20;
  
  local_50._M_dataplus._M_p = (pointer)&local_20;
  local_20.first = this;
  local_20.second = info;
  if ((this->locations_by_path_once_).control_.super___atomic_base<unsigned_int>._M_i != 0xdd) {
    absl::lts_20250127::base_internal::
    CallOnceImpl<void(&)(std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>*),std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>*>
              (&(this->locations_by_path_once_).control_,SCHEDULE_COOPERATIVE_AND_KERNEL,
               BuildLocationsByPath,
               (pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
                **)&local_50);
  }
  s._M_str = &stack0xffffffffffffffaf;
  s._M_len = (size_t)",";
  absl::lts_20250127::strings_internal::
  JoinAlgorithm<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,absl::lts_20250127::strings_internal::AlphaNumFormatterImpl>
            (&local_50,
             (strings_internal *)
             (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)0x1,s,
             in_stack_ffffffffffffffa8);
  local_30 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
             ::find<std::__cxx11::string>
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
                         *)&this->locations_by_path_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
              *)&this->locations_by_path_);
  local_50._M_dataplus._M_p = (pointer)0x0;
  bVar1 = absl::lts_20250127::container_internal::operator==(&local_30,(iterator *)&local_50);
  if (bVar1) {
    pSVar2 = (SourceCodeInfo_Location *)0x0;
  }
  else {
    prVar3 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
             ::iterator::operator->(&local_30);
    pSVar2 = prVar3->second;
  }
  return pSVar2;
}

Assistant:

const SourceCodeInfo_Location* FileDescriptorTables::GetSourceLocation(
    const std::vector<int>& path, const SourceCodeInfo* info) const {
  std::pair<const FileDescriptorTables*, const SourceCodeInfo*> p(
      std::make_pair(this, info));
  absl::call_once(locations_by_path_once_,
                  FileDescriptorTables::BuildLocationsByPath, &p);
  auto it = locations_by_path_.find(absl::StrJoin(path, ","));
  if (it == locations_by_path_.end()) return nullptr;
  return it->second;
}